

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrimmedSurfaceClipping.h
# Opt level: O1

bool anurbs::TrimmedSurfaceClipping::is_rect(Path *a,Path *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool local_1b5;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_1b0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_198;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_180;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_168;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_150;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_138;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_120;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_108;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_f0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_d8;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_c0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_a8;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_90;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_78;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_60;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_48;
  
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_60,a);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_78,b);
  if ((((((local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->X !=
          (local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->X) ||
        ((local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start)->Y !=
         (local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start)->Y)) ||
       (local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[1].X !=
        local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[1].X)) ||
      ((local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[1].Y !=
        local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[1].Y ||
       (local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[2].X !=
        local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[2].X)))) ||
     ((local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
       _M_impl.super__Vector_impl_data._M_start[2].Y !=
       local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
       _M_impl.super__Vector_impl_data._M_start[2].Y ||
      ((local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[3].X !=
        local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start[3].X ||
       (bVar1 = true,
       local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
       _M_impl.super__Vector_impl_data._M_start[3].Y !=
       local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
       _M_impl.super__Vector_impl_data._M_start[3].Y)))))) {
    bVar1 = false;
  }
  if (!bVar1) {
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_90,a);
    std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_a8,b);
    if ((((local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_start[1].X !=
           (local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start)->X) ||
         (local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[1].Y !=
          (local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_start)->Y)) ||
        (local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_start[2].X !=
         local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_start[1].X)) ||
       (((local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[2].Y !=
          local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[1].Y ||
         (local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[3].X !=
          local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[2].X)) ||
        ((local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[3].Y !=
          local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_start[2].Y ||
         (((local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start)->X !=
           local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_start[3].X ||
          ((local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start)->Y !=
           local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
           _M_impl.super__Vector_impl_data._M_start[3].Y)))))))) {
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_c0,a);
      std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector(&local_d8,b);
      if (((local_d8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[2].X ==
            (local_c0.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start)->X) &&
          (((local_d8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[2].Y ==
             (local_c0.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start)->Y &&
            (local_d8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[3].X ==
             local_c0.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[1].X)) &&
           (local_d8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[3].Y ==
            local_c0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[1].Y)))) &&
         ((((local_d8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start)->X ==
            local_c0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[2].X &&
           ((local_d8.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start)->Y ==
            local_c0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[2].Y)) &&
          ((local_d8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[1].X ==
            local_c0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[3].X &&
           (local_d8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[1].Y ==
            local_c0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
            ._M_impl.super__Vector_impl_data._M_start[3].Y)))))) {
        bVar5 = false;
LAB_001e2a3b:
        bVar4 = false;
LAB_001e2ad2:
        bVar3 = false;
LAB_001e2b60:
        bVar2 = false;
      }
      else {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_f0,a);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_108,b);
        if ((((local_108.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[3].X ==
               (local_f0.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start)->X) &&
             (local_108.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[3].Y ==
              (local_f0.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start)->Y)) &&
            ((local_108.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start)->X ==
             local_f0.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[1].X)) &&
           (((((local_108.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start)->Y ==
               local_f0.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[1].Y &&
              (local_108.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[1].X ==
               local_f0.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[2].X)) &&
             (local_108.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[1].Y ==
              local_f0.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[2].Y)) &&
            ((local_108.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[2].X ==
              local_f0.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[3].X &&
             (local_108.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[2].Y ==
              local_f0.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[3].Y)))))) {
          bVar5 = true;
          goto LAB_001e2a3b;
        }
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_120,a);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_138,b);
        if ((((local_138.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[3].X ==
               (local_120.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start)->X) &&
             ((local_138.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[3].Y ==
               (local_120.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start)->Y &&
              (local_138.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[2].X ==
               local_120.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[1].X)))) &&
            (local_138.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[2].Y ==
             local_120.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[1].Y)) &&
           ((((local_138.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[1].X ==
               local_120.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[2].X &&
              (local_138.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[1].Y ==
               local_120.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[2].Y)) &&
             ((local_138.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start)->X ==
              local_120.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[3].X)) &&
            ((local_138.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start)->Y ==
             local_120.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start[3].Y)))) {
          bVar5 = true;
          bVar4 = true;
          goto LAB_001e2ad2;
        }
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_150,a);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_168,b);
        if ((((local_168.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start)->X ==
              (local_150.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start)->X) &&
            ((local_168.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start)->Y ==
             (local_150.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start)->Y)) &&
           ((((local_168.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[3].X ==
               local_150.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start[1].X &&
              ((local_168.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start[3].Y ==
                local_150.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start[1].Y &&
               (local_168.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start[2].X ==
                local_150.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_start[2].X)))) &&
             (local_168.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[2].Y ==
              local_150.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[2].Y)) &&
            ((local_168.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[1].X ==
              local_150.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[3].X &&
             (local_168.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[1].Y ==
              local_150.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start[3].Y)))))) {
          bVar5 = true;
          bVar4 = true;
          bVar3 = true;
          goto LAB_001e2b60;
        }
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_180,a);
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                  (&local_198,b);
        bVar7 = is_rect(&local_180,&local_198,1,0,3,2);
        if (!bVar7) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                    (&local_1b0,a);
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
                    (&local_48,b);
          local_1b5 = is_rect(&local_1b0,&local_48,2,1,0,3);
          bVar6 = true;
          bVar5 = true;
          bVar4 = true;
          bVar3 = true;
          bVar2 = true;
          bVar7 = true;
          goto LAB_001e2c1e;
        }
        bVar5 = true;
        bVar4 = true;
        bVar3 = true;
        bVar2 = true;
      }
      bVar6 = true;
      bVar7 = false;
      local_1b5 = true;
      goto LAB_001e2c1e;
    }
  }
  local_1b5 = true;
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  bVar7 = false;
LAB_001e2c1e:
  if (bVar7) {
    if (local_48.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1b0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1b0.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b0.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar2) {
    if (local_198.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_180.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar3) {
    if (local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_150.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_150.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar4) {
    if (local_138.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_120.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_120.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_120.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_120.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar5) {
    if (local_108.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f0.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_f0.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (bVar6) {
    if (local_d8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_d8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_c0.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c0.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (!bVar1) {
    if (local_a8.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_90.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.
                            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_78.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_1b5;
}

Assistant:

static inline bool is_rect(ClipperLib::Path a, ClipperLib::Path b)
    {
        return is_rect(a, b, 0, 1, 2, 3) || is_rect(a, b, 1, 2, 3, 0) || is_rect(a, b, 2, 3, 0, 1) || is_rect(a, b, 3, 0, 1, 2) || is_rect(a, b, 3, 2, 1, 0) || is_rect(a, b, 0, 3, 2, 1) || is_rect(a, b, 1, 0, 3, 2) || is_rect(a, b, 2, 1, 0, 3);
    }